

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.c
# Opt level: O1

MESSAGE_HANDLE message_clone(MESSAGE_HANDLE source_message)

{
  BODY_AMQP_DATA *pBVar1;
  MESSAGE_HANDLE message;
  HEADER_HANDLE pHVar2;
  LOGGER_LOG p_Var3;
  AMQP_VALUE pAVar4;
  PROPERTIES_HANDLE pPVar5;
  BODY_AMQP_DATA *pBVar6;
  void *__dest;
  AMQP_VALUE *ppAVar7;
  int iVar8;
  long lVar9;
  char *pcVar10;
  size_t sVar11;
  size_t sVar12;
  ulong uVar13;
  
  if (source_message == (MESSAGE_HANDLE)0x0) {
    p_Var3 = xlogging_get_log_function();
    if (p_Var3 == (LOGGER_LOG)0x0) {
      return (MESSAGE_HANDLE)0x0;
    }
    pcVar10 = "NULL source_message";
    iVar8 = 0x8c;
LAB_0016b7c6:
    (*p_Var3)(AZ_LOG_ERROR,
              "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/message.c"
              ,"message_clone",iVar8,1,pcVar10);
    return (MESSAGE_HANDLE)0x0;
  }
  message = message_create();
  if (message == (MESSAGE_HANDLE)0x0) {
    p_Var3 = xlogging_get_log_function();
    if (p_Var3 == (LOGGER_LOG)0x0) {
      return (MESSAGE_HANDLE)0x0;
    }
    pcVar10 = "Cannot clone message";
    iVar8 = 0x96;
    goto LAB_0016b7c6;
  }
  message->message_format = source_message->message_format;
  if (source_message->header != (HEADER_HANDLE)0x0) {
    pHVar2 = header_clone(source_message->header);
    message->header = pHVar2;
    if (pHVar2 == (HEADER_HANDLE)0x0) {
      p_Var3 = xlogging_get_log_function();
      if (p_Var3 != (LOGGER_LOG)0x0) {
        (*p_Var3)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/message.c"
                  ,"message_clone",0xa3,1,"Cannot clone message header");
      }
      message_destroy(message);
      message = (MESSAGE_HANDLE)0x0;
    }
  }
  if (message == (MESSAGE_HANDLE)0x0) {
LAB_0016b5a7:
    message = (MESSAGE_HANDLE)0x0;
  }
  else if (source_message->delivery_annotations != (AMQP_VALUE)0x0) {
    pAVar4 = amqpvalue_clone(source_message->delivery_annotations);
    message->delivery_annotations = pAVar4;
    if (pAVar4 == (AMQP_VALUE)0x0) {
      p_Var3 = xlogging_get_log_function();
      if (p_Var3 != (LOGGER_LOG)0x0) {
        (*p_Var3)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/message.c"
                  ,"message_clone",0xb0,1,"Cannot clone delivery annotations");
      }
      message_destroy(message);
      goto LAB_0016b5a7;
    }
  }
  if (message == (MESSAGE_HANDLE)0x0) {
LAB_0016b601:
    message = (MESSAGE_HANDLE)0x0;
  }
  else if (source_message->message_annotations != (AMQP_VALUE)0x0) {
    pAVar4 = amqpvalue_clone(source_message->message_annotations);
    message->message_annotations = pAVar4;
    if (pAVar4 == (AMQP_VALUE)0x0) {
      p_Var3 = xlogging_get_log_function();
      if (p_Var3 != (LOGGER_LOG)0x0) {
        (*p_Var3)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/message.c"
                  ,"message_clone",0xbd,1,"Cannot clone message annotations");
      }
      message_destroy(message);
      goto LAB_0016b601;
    }
  }
  if (message == (MESSAGE_HANDLE)0x0) {
LAB_0016b65b:
    message = (MESSAGE_HANDLE)0x0;
  }
  else if (source_message->properties != (PROPERTIES_HANDLE)0x0) {
    pPVar5 = properties_clone(source_message->properties);
    message->properties = pPVar5;
    if (pPVar5 == (PROPERTIES_HANDLE)0x0) {
      p_Var3 = xlogging_get_log_function();
      if (p_Var3 != (LOGGER_LOG)0x0) {
        (*p_Var3)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/message.c"
                  ,"message_clone",0xca,1,"Cannot clone message properties");
      }
      message_destroy(message);
      goto LAB_0016b65b;
    }
  }
  if (message == (MESSAGE_HANDLE)0x0) {
LAB_0016b6b5:
    message = (MESSAGE_HANDLE)0x0;
  }
  else if (source_message->application_properties != (AMQP_VALUE)0x0) {
    pAVar4 = amqpvalue_clone(source_message->application_properties);
    message->application_properties = pAVar4;
    if (pAVar4 == (AMQP_VALUE)0x0) {
      p_Var3 = xlogging_get_log_function();
      if (p_Var3 != (LOGGER_LOG)0x0) {
        (*p_Var3)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/message.c"
                  ,"message_clone",0xd7,1,"Cannot clone application annotations");
      }
      message_destroy(message);
      goto LAB_0016b6b5;
    }
  }
  if (message == (MESSAGE_HANDLE)0x0) {
LAB_0016b70f:
    message = (MESSAGE_HANDLE)0x0;
  }
  else if (source_message->footer != (AMQP_VALUE)0x0) {
    pAVar4 = amqpvalue_clone(source_message->footer);
    message->footer = pAVar4;
    if (pAVar4 == (AMQP_VALUE)0x0) {
      p_Var3 = xlogging_get_log_function();
      if (p_Var3 != (LOGGER_LOG)0x0) {
        (*p_Var3)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/message.c"
                  ,"message_clone",0xe4,1,"Cannot clone message footer");
      }
      message_destroy(message);
      goto LAB_0016b70f;
    }
  }
  if (message == (MESSAGE_HANDLE)0x0) {
LAB_0016b8d5:
    message = (MESSAGE_HANDLE)0x0;
  }
  else {
    uVar13 = source_message->body_amqp_data_count;
    if (uVar13 != 0) {
      if (uVar13 >> 0x3c == 0) {
        pBVar6 = (BODY_AMQP_DATA *)calloc(1,uVar13 << 4);
        message->body_amqp_data_items = pBVar6;
        if (pBVar6 == (BODY_AMQP_DATA *)0x0) {
          p_Var3 = xlogging_get_log_function();
          if (p_Var3 != (LOGGER_LOG)0x0) {
            pcVar10 = "Cannot allocate memory for body data sections";
            iVar8 = 0xfb;
            goto LAB_0016b874;
          }
        }
        else {
          sVar12 = source_message->body_amqp_data_count;
          if (sVar12 == 0) {
            sVar12 = 0;
          }
          else {
            pBVar6 = source_message->body_amqp_data_items;
            lVar9 = 8;
            sVar11 = 0;
            do {
              pBVar1 = message->body_amqp_data_items;
              *(undefined8 *)((long)&pBVar1->body_data_section_bytes + lVar9) =
                   *(undefined8 *)((long)&pBVar6->body_data_section_bytes + lVar9);
              __dest = malloc(*(size_t *)((long)&pBVar6->body_data_section_bytes + lVar9));
              *(void **)((long)pBVar1 + lVar9 + -8) = __dest;
              if (__dest == (void *)0x0) {
                p_Var3 = xlogging_get_log_function();
                sVar12 = sVar11;
                if (p_Var3 != (LOGGER_LOG)0x0) {
                  (*p_Var3)(AZ_LOG_ERROR,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/message.c"
                            ,"message_clone",0x10b,1,
                            "Cannot allocate memory for body data section %u",(int)sVar11);
                }
                break;
              }
              memcpy(__dest,*(void **)((long)pBVar6 + lVar9 + -8),
                     *(size_t *)((long)&pBVar1->body_data_section_bytes + lVar9));
              sVar11 = sVar11 + 1;
              lVar9 = lVar9 + 0x10;
            } while (sVar12 != sVar11);
          }
          message->body_amqp_data_count = sVar12;
          if (source_message->body_amqp_data_count <= sVar12) goto LAB_0016b8d7;
        }
      }
      else {
        p_Var3 = xlogging_get_log_function();
        if (p_Var3 != (LOGGER_LOG)0x0) {
          pcVar10 = "Invalid size for body_amqp_data_items";
          iVar8 = 0xf0;
LAB_0016b874:
          (*p_Var3)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/message.c"
                    ,"message_clone",iVar8,1,pcVar10);
        }
      }
      message_destroy(message);
      goto LAB_0016b8d5;
    }
  }
LAB_0016b8d7:
  if (message != (MESSAGE_HANDLE)0x0) {
    uVar13 = source_message->body_amqp_sequence_count;
    if (uVar13 == 0) goto LAB_0016b9f8;
    if (uVar13 >> 0x3d == 0) {
      ppAVar7 = (AMQP_VALUE *)calloc(1,uVar13 << 3);
      message->body_amqp_sequence_items = ppAVar7;
      if (ppAVar7 == (AMQP_VALUE *)0x0) {
        p_Var3 = xlogging_get_log_function();
        if (p_Var3 != (LOGGER_LOG)0x0) {
          pcVar10 = "Cannot allocate memory for body AMQP sequences";
          iVar8 = 0x12f;
          goto LAB_0016b99a;
        }
      }
      else {
        if (source_message->body_amqp_sequence_count == 0) {
          uVar13 = 0;
        }
        else {
          uVar13 = 0;
          do {
            pAVar4 = amqpvalue_clone(source_message->body_amqp_sequence_items[uVar13]);
            message->body_amqp_sequence_items[uVar13] = pAVar4;
            if (message->body_amqp_sequence_items[uVar13] == (AMQP_VALUE)0x0) {
              p_Var3 = xlogging_get_log_function();
              if (p_Var3 != (LOGGER_LOG)0x0) {
                (*p_Var3)(AZ_LOG_ERROR,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/message.c"
                          ,"message_clone",0x13d,1,"Cannot clone AMQP sequence %u",(int)uVar13);
              }
              break;
            }
            uVar13 = uVar13 + 1;
          } while (uVar13 < source_message->body_amqp_sequence_count);
        }
        message->body_amqp_sequence_count = uVar13;
        if (source_message->body_amqp_sequence_count <= uVar13) goto LAB_0016b9f8;
      }
    }
    else {
      p_Var3 = xlogging_get_log_function();
      if (p_Var3 != (LOGGER_LOG)0x0) {
        pcVar10 = "Invalid size for body_amqp_sequence_items";
        iVar8 = 0x125;
LAB_0016b99a:
        (*p_Var3)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/message.c"
                  ,"message_clone",iVar8,1,pcVar10);
      }
    }
    message_destroy(message);
  }
  message = (MESSAGE_HANDLE)0x0;
LAB_0016b9f8:
  if (message != (MESSAGE_HANDLE)0x0) {
    if (source_message->body_amqp_value == (AMQP_VALUE)0x0) {
      return message;
    }
    pAVar4 = amqpvalue_clone(source_message->body_amqp_value);
    message->body_amqp_value = pAVar4;
    if (pAVar4 != (AMQP_VALUE)0x0) {
      return message;
    }
    p_Var3 = xlogging_get_log_function();
    if (p_Var3 != (LOGGER_LOG)0x0) {
      (*p_Var3)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/message.c"
                ,"message_clone",0x154,1,"Cannot clone body AMQP value");
    }
    message_destroy(message);
  }
  return (MESSAGE_HANDLE)0x0;
}

Assistant:

MESSAGE_HANDLE message_clone(MESSAGE_HANDLE source_message)
{
    MESSAGE_HANDLE result;

    if (source_message == NULL)
    {
        /* Codes_SRS_MESSAGE_01_062: [If `source_message` is NULL, `message_clone` shall fail and return NULL.] */
        LogError("NULL source_message");
        result = NULL;
    }
    else
    {
        /* Codes_SRS_MESSAGE_01_003: [`message_clone` shall clone a message entirely and on success return a non-NULL handle to the cloned message.] */
        result = (MESSAGE_HANDLE)message_create();
        if (result == NULL)
        {
            /* Codes_SRS_MESSAGE_01_004: [If allocating memory for the new cloned message fails, `message_clone` shall fail and return NULL.] */
            LogError("Cannot clone message");
        }
        else
        {
            result->message_format = source_message->message_format;

            if (source_message->header != NULL)
            {
                /* Codes_SRS_MESSAGE_01_005: [If a header exists on the source message it shall be cloned by using `header_clone`.] */
                result->header = header_clone(source_message->header);
                if (result->header == NULL)
                {
                    /* Codes_SRS_MESSAGE_01_012: [ If any cloning operation for the members of the source message fails, then `message_clone` shall fail and return NULL. ]*/
                    LogError("Cannot clone message header");
                    message_destroy(result);
                    result = NULL;
                }
            }

            if ((result != NULL) && (source_message->delivery_annotations != NULL))
            {
                /* Codes_SRS_MESSAGE_01_006: [If delivery annotations exist on the source message they shall be cloned by using `annotations_clone`.] */
                result->delivery_annotations = annotations_clone(source_message->delivery_annotations);
                if (result->delivery_annotations == NULL)
                {
                    /* Codes_SRS_MESSAGE_01_012: [ If any cloning operation for the members of the source message fails, then `message_clone` shall fail and return NULL. ]*/
                    LogError("Cannot clone delivery annotations");
                    message_destroy(result);
                    result = NULL;
                }
            }

            if ((result != NULL) && (source_message->message_annotations != NULL))
            {
                /* Codes_SRS_MESSAGE_01_007: [If message annotations exist on the source message they shall be cloned by using `annotations_clone`.] */
                result->message_annotations = annotations_clone(source_message->message_annotations);
                if (result->message_annotations == NULL)
                {
                    /* Codes_SRS_MESSAGE_01_012: [ If any cloning operation for the members of the source message fails, then `message_clone` shall fail and return NULL. ]*/
                    LogError("Cannot clone message annotations");
                    message_destroy(result);
                    result = NULL;
                }
            }

            if ((result != NULL) && (source_message->properties != NULL))
            {
                /* Codes_SRS_MESSAGE_01_008: [If message properties exist on the source message they shall be cloned by using `properties_clone`.] */
                result->properties = properties_clone(source_message->properties);
                if (result->properties == NULL)
                {
                    /* Codes_SRS_MESSAGE_01_012: [ If any cloning operation for the members of the source message fails, then `message_clone` shall fail and return NULL. ]*/
                    LogError("Cannot clone message properties");
                    message_destroy(result);
                    result = NULL;
                }
            }

            if ((result != NULL) && (source_message->application_properties != NULL))
            {
                /* Codes_SRS_MESSAGE_01_009: [If application properties exist on the source message they shall be cloned by using `amqpvalue_clone`.] */
                result->application_properties = amqpvalue_clone(source_message->application_properties);
                if (result->application_properties == NULL)
                {
                    /* Codes_SRS_MESSAGE_01_012: [ If any cloning operation for the members of the source message fails, then `message_clone` shall fail and return NULL. ]*/
                    LogError("Cannot clone application annotations");
                    message_destroy(result);
                    result = NULL;
                }
            }

            if ((result != NULL) && (source_message->footer != NULL))
            {
                /* Codes_SRS_MESSAGE_01_010: [If a footer exists on the source message it shall be cloned by using `annotations_clone`.] */
                result->footer = amqpvalue_clone(source_message->footer);
                if (result->footer == NULL)
                {
                    /* Codes_SRS_MESSAGE_01_012: [ If any cloning operation for the members of the source message fails, then `message_clone` shall fail and return NULL. ]*/
                    LogError("Cannot clone message footer");
                    message_destroy(result);
                    result = NULL;
                }
            }

            if ((result != NULL) && (source_message->body_amqp_data_count > 0))
            {
                size_t calloc_size = safe_multiply_size_t(source_message->body_amqp_data_count, sizeof(BODY_AMQP_DATA));

                if (calloc_size == SIZE_MAX)
                {
                    LogError("Invalid size for body_amqp_data_items");
                    message_destroy(result);
                    result = NULL;
                }
                else
                {
                    result->body_amqp_data_items = (BODY_AMQP_DATA*)calloc(1, calloc_size);

                    if (result->body_amqp_data_items == NULL)
                    {
                        /* Codes_SRS_MESSAGE_01_012: [ If any cloning operation for the members of the source message fails, then `message_clone` shall fail and return NULL. ]*/
                        LogError("Cannot allocate memory for body data sections");
                        message_destroy(result);
                        result = NULL;
                    }
                    else
                    {
                        size_t i;

                        for (i = 0; i < source_message->body_amqp_data_count; i++)
                        {
                            result->body_amqp_data_items[i].body_data_section_length = source_message->body_amqp_data_items[i].body_data_section_length;

                            /* Codes_SRS_MESSAGE_01_011: [If an AMQP data has been set as message body on the source message it shall be cloned by allocating memory for the binary payload.] */
                            result->body_amqp_data_items[i].body_data_section_bytes = (unsigned char*)malloc(source_message->body_amqp_data_items[i].body_data_section_length);
                            if (result->body_amqp_data_items[i].body_data_section_bytes == NULL)
                            {
                                LogError("Cannot allocate memory for body data section %u", (unsigned int)i);
                                break;
                            }
                            else
                            {
                                (void)memcpy(result->body_amqp_data_items[i].body_data_section_bytes, source_message->body_amqp_data_items[i].body_data_section_bytes, result->body_amqp_data_items[i].body_data_section_length);
                            }
                        }

                        result->body_amqp_data_count = i;
                        if (i < source_message->body_amqp_data_count)
                        {
                            /* Codes_SRS_MESSAGE_01_012: [ If any cloning operation for the members of the source message fails, then `message_clone` shall fail and return NULL. ]*/
                            message_destroy(result);
                            result = NULL;
                        }
                    }
                }
            }

            if ((result != NULL) && (source_message->body_amqp_sequence_count > 0))
            {
                size_t calloc_size = safe_multiply_size_t(source_message->body_amqp_sequence_count, sizeof(AMQP_VALUE));

                if (calloc_size == SIZE_MAX)
                {
                    LogError("Invalid size for body_amqp_sequence_items");
                    message_destroy(result);
                    result = NULL;
                }
                else
                {
                    result->body_amqp_sequence_items = (AMQP_VALUE*)calloc(1, calloc_size);
                    if (result->body_amqp_sequence_items == NULL)
                    {
                        /* Codes_SRS_MESSAGE_01_012: [ If any cloning operation for the members of the source message fails, then `message_clone` shall fail and return NULL. ]*/
                        LogError("Cannot allocate memory for body AMQP sequences");
                        message_destroy(result);
                        result = NULL;
                    }
                    else
                    {
                        size_t i;

                        for (i = 0; i < source_message->body_amqp_sequence_count; i++)
                        {
                            /* Codes_SRS_MESSAGE_01_160: [ If AMQP sequences are set as AMQP body they shall be cloned by calling `amqpvalue_clone`. ] */
                            result->body_amqp_sequence_items[i] = amqpvalue_clone(source_message->body_amqp_sequence_items[i]);
                            if (result->body_amqp_sequence_items[i] == NULL)
                            {
                                LogError("Cannot clone AMQP sequence %u", (unsigned int)i);
                                break;
                            }
                        }

                        result->body_amqp_sequence_count = i;
                        if (i < source_message->body_amqp_sequence_count)
                        {
                            /* Codes_SRS_MESSAGE_01_012: [ If any cloning operation for the members of the source message fails, then `message_clone` shall fail and return NULL. ]*/
                            message_destroy(result);
                            result = NULL;
                        }
                    }
				}
            }

            if ((result != NULL) && (source_message->body_amqp_value != NULL))
            {
                /* Codes_SRS_MESSAGE_01_159: [If an AMQP value has been set as message body on the source message it shall be cloned by calling `amqpvalue_clone`. ]*/
                result->body_amqp_value = amqpvalue_clone(source_message->body_amqp_value);
                if (result->body_amqp_value == NULL)
                {
                    /* Codes_SRS_MESSAGE_01_012: [ If any cloning operation for the members of the source message fails, then `message_clone` shall fail and return NULL. ]*/
                    LogError("Cannot clone body AMQP value");
                    message_destroy(result);
                    result = NULL;
                }
            }
        }
    }

    return result;
}